

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O2

secp256k1_pubkey * cfd::core::ParsePubkey(secp256k1_pubkey *__return_storage_ptr__,Pubkey *pubkey)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  allocator local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  string local_38;
  
  Pubkey::GetData((ByteData *)&local_38,pubkey);
  ByteData::GetBytes(&pubkey_bytes,(ByteData *)&local_38);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  ctx = wally_get_secp_context();
  iVar1 = secp256k1_ec_pubkey_parse
                    (ctx,__return_storage_ptr__,
                     pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)pubkey_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)pubkey_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  if (iVar1 == 1) {
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_38,"Secp256k1 pubkey parse error",&local_51);
  CfdException::CfdException(this,kCfdInternalError,&local_38);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

secp256k1_pubkey ParsePubkey(const Pubkey& pubkey) {
  auto pubkey_bytes = pubkey.GetData().GetBytes();
  auto ctx = wally_get_secp_context();
  secp256k1_pubkey result;
  int ret = secp256k1_ec_pubkey_parse(
      ctx, &result, pubkey_bytes.data(), pubkey_bytes.size());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Secp256k1 pubkey parse error");
  }

  return result;
}